

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.cpp
# Opt level: O1

void __thiscall zmq::xsub_t::xsub_t(xsub_t *this,ctx_t *parent_,uint32_t tid_,int sid_)

{
  int iVar1;
  int *piVar2;
  char *errmsg_;
  
  socket_base_t::socket_base_t(&this->super_socket_base_t,parent_,tid_,sid_,false);
  (this->super_socket_base_t).super_own_t.super_object_t._vptr_object_t =
       (_func_int **)&PTR__xsub_t_00266478;
  (this->super_socket_base_t).super_array_item_t<0>._vptr_array_item_t = (_func_int **)&DAT_002665e8
  ;
  (this->super_socket_base_t).super_i_poll_events._vptr_i_poll_events =
       (_func_int **)&PTR__xsub_t_00266608;
  (this->super_socket_base_t).super_i_pipe_events._vptr_i_pipe_events =
       (_func_int **)&PTR__xsub_t_00266640;
  fq_t::fq_t(&this->_fq);
  dist_t::dist_t(&this->_dist);
  radix_tree_t::radix_tree_t(&this->_subscriptions);
  this->_has_message = false;
  this->_more_send = false;
  this->_more_recv = false;
  this->_process_subscribe = false;
  this->_only_first_subscribe = false;
  (this->super_socket_base_t).super_own_t.options.type = '\n';
  (this->super_socket_base_t).super_own_t.options.linger._value.super___atomic_base<int>._M_i = 0;
  iVar1 = msg_t::init(&this->_message,(EVP_PKEY_CTX *)parent_);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    errmsg_ = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/xsub.cpp"
            ,0x34);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  return;
}

Assistant:

zmq::xsub_t::xsub_t (class ctx_t *parent_, uint32_t tid_, int sid_) :
    socket_base_t (parent_, tid_, sid_),
    _has_message (false),
    _more_send (false),
    _more_recv (false),
    _process_subscribe (false),
    _only_first_subscribe (false)
{
    options.type = ZMQ_XSUB;

    //  When socket is being closed down we don't want to wait till pending
    //  subscription commands are sent to the wire.
    options.linger.store (0);

    const int rc = _message.init ();
    errno_assert (rc == 0);
}